

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ChainPromiseNode::setSelfPointer(ChainPromiseNode *this,Own<kj::_::PromiseNode> *selfPtr)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  Own<kj::_::PromiseNode> *selfPtr_local;
  ChainPromiseNode *this_local;
  
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    other = mv<kj::Own<kj::_::PromiseNode>>(&this->inner);
    Own<kj::_::PromiseNode>::operator=(selfPtr,other);
    pPVar1 = Own<kj::_::PromiseNode>::get(selfPtr);
    (*pPVar1->_vptr_PromiseNode[1])(pPVar1,selfPtr);
  }
  else {
    this->selfPtr = selfPtr;
  }
  return;
}

Assistant:

void ChainPromiseNode::setSelfPointer(Own<PromiseNode>* selfPtr) noexcept {
  if (state == STEP2) {
    *selfPtr = kj::mv(inner);  // deletes this!
    selfPtr->get()->setSelfPointer(selfPtr);
  } else {
    this->selfPtr = selfPtr;
  }
}